

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_reader.hpp
# Opt level: O2

CmdValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
* __thiscall
CmdValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
::operator>>(CmdValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *val)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  cpp_dec_float<100U,_int,_void> local_68;
  
  iVar3 = *(int *)&(this->
                   super_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   ).field_0xc;
  while( true ) {
    if (this->argc <= iVar3) {
      (this->
      super_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ).finished = true;
      return this;
    }
    bVar2 = IsInteger(this->argv[iVar3]);
    if (bVar2) break;
    iVar3 = *(int *)&(this->
                     super_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     ).field_0xc + 1;
    *(int *)&(this->
             super_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
             ).field_0xc = iVar3;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (&local_68,
             this->argv
             [*(int *)&(this->
                       super_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       ).field_0xc]);
  *(undefined8 *)((val->m_backend).data._M_elems + 0xc) = local_68.data._M_elems._48_8_;
  *(undefined8 *)((val->m_backend).data._M_elems + 0xe) = local_68.data._M_elems._56_8_;
  *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_68.data._M_elems._32_8_;
  *(undefined8 *)((val->m_backend).data._M_elems + 10) = local_68.data._M_elems._40_8_;
  *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_68.data._M_elems._16_8_;
  *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_68.data._M_elems._24_8_;
  *(undefined8 *)(val->m_backend).data._M_elems = local_68.data._M_elems._0_8_;
  *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_68.data._M_elems._8_8_;
  (val->m_backend).exp = local_68.exp;
  (val->m_backend).neg = local_68.neg;
  (val->m_backend).fpclass = local_68.fpclass;
  (val->m_backend).prec_elem = local_68.prec_elem;
  puVar1 = &(this->
            super_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
            ).field_0xc;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  return this;
}

Assistant:

CmdValueReader &operator>>(ValueType &val) override {
        while (pos < argc) {
            if (!IsInteger(argv[pos])) {
                ++pos;
                continue;
            }
            val = ReadInteger<ValueType>(argv[pos]);
            ++pos;
            return *this;
        }
        this->finished = true;
        return *this;
    }